

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa_ossl.c
# Opt level: O0

int dsa_do_verify(uchar *dgst,int dgst_len,DSA_SIG *sig,DSA *dsa)

{
  int iVar1;
  int iVar2;
  BIGNUM *pBVar3;
  long in_RCX;
  DSA_SIG *in_RDX;
  int in_ESI;
  uchar *in_RDI;
  int i;
  int ret;
  BIGNUM *s;
  BIGNUM *r;
  BN_MONT_CTX *mont;
  BIGNUM *t1;
  BIGNUM *u2;
  BIGNUM *u1;
  BN_CTX *ctx;
  OSSL_LIB_CTX *in_stack_ffffffffffffff78;
  BN_MONT_CTX *in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  int line;
  BN_MONT_CTX *pBVar4;
  undefined4 in_stack_ffffffffffffff90;
  uint uVar5;
  BIGNUM *local_68;
  BIGNUM *local_60;
  BN_MONT_CTX *local_58;
  BIGNUM *local_50;
  BIGNUM *local_48;
  BIGNUM *local_40;
  BN_MONT_CTX *local_38;
  long local_30;
  DSA_SIG *local_28;
  int local_1c;
  uchar *local_18;
  uint local_c;
  
  line = (int)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  local_58 = (BN_MONT_CTX *)0x0;
  uVar5 = 0xffffffff;
  if (((*(long *)(in_RCX + 8) == 0) || (*(long *)(in_RCX + 0x10) == 0)) ||
     (*(long *)(in_RCX + 0x18) == 0)) {
    ERR_new();
    ERR_set_debug((char *)CONCAT44(uVar5,in_stack_ffffffffffffff90),line,
                  (char *)in_stack_ffffffffffffff80);
    ERR_set_error(10,0x65,(char *)0x0);
    local_c = 0xffffffff;
  }
  else {
    local_30 = in_RCX;
    local_28 = in_RDX;
    local_1c = in_ESI;
    local_18 = in_RDI;
    iVar1 = BN_num_bits(*(BIGNUM **)(in_RCX + 0x10));
    if (((iVar1 == 0xa0) || (iVar1 == 0xe0)) || (iVar1 == 0x100)) {
      iVar2 = BN_num_bits(*(BIGNUM **)(local_30 + 8));
      if (iVar2 < 0x2711) {
        local_40 = BN_new();
        local_48 = BN_new();
        local_50 = BN_new();
        local_38 = (BN_MONT_CTX *)BN_CTX_new_ex(in_stack_ffffffffffffff78);
        if (((local_40 != (BIGNUM *)0x0) && (local_48 != (BIGNUM *)0x0)) &&
           ((local_50 != (BIGNUM *)0x0 && (local_38 != (BN_MONT_CTX *)0x0)))) {
          DSA_SIG_get0(local_28,&local_60,&local_68);
          iVar2 = BN_is_zero(local_60);
          if (((iVar2 == 0) && (iVar2 = BN_is_negative(local_60), iVar2 == 0)) &&
             (iVar2 = BN_ucmp((BIGNUM *)local_60,*(BIGNUM **)(local_30 + 0x10)), iVar2 < 0)) {
            iVar2 = BN_is_zero(local_68);
            if (((iVar2 == 0) && (iVar2 = BN_is_negative(local_68), iVar2 == 0)) &&
               (iVar2 = BN_ucmp((BIGNUM *)local_68,*(BIGNUM **)(local_30 + 0x10)), iVar2 < 0)) {
              pBVar3 = BN_mod_inverse(local_48,(BIGNUM *)local_68,*(BIGNUM **)(local_30 + 0x10),
                                      (BN_CTX *)local_38);
              if (pBVar3 != (BIGNUM *)0x0) {
                if (iVar1 >> 3 < local_1c) {
                  local_1c = iVar1 >> 3;
                }
                pBVar3 = BN_bin2bn(local_18,local_1c,local_40);
                if (((pBVar3 != (BIGNUM *)0x0) &&
                    (iVar2 = BN_mod_mul(local_40,local_40,local_48,*(BIGNUM **)(local_30 + 0x10),
                                        (BN_CTX *)local_38), iVar2 != 0)) &&
                   ((iVar2 = BN_mod_mul(local_48,(BIGNUM *)local_60,local_48,
                                        *(BIGNUM **)(local_30 + 0x10),(BN_CTX *)local_38),
                    iVar2 != 0 &&
                    (((*(uint *)(local_30 + 0x70) & 1) == 0 ||
                     (local_58 = BN_MONT_CTX_set_locked
                                           ((BN_MONT_CTX **)(local_30 + 0x78),
                                            (int)*(undefined8 *)(local_30 + 0xa8),
                                            *(BIGNUM **)(local_30 + 8),(BN_CTX *)local_38),
                     local_58 != (BN_MONT_CTX *)0x0)))))) {
                  if (*(long *)(*(long *)(local_30 + 0x98) + 0x20) == 0) {
                    in_stack_ffffffffffffff80 = (BN_MONT_CTX *)local_58;
                    iVar2 = BN_mod_exp2_mont((BIGNUM *)local_50,*(BIGNUM **)(local_30 + 0x18),
                                             (BIGNUM *)local_40,*(BIGNUM **)(local_30 + 0x60),
                                             (BIGNUM *)local_48,*(BIGNUM **)(local_30 + 8),
                                             (BN_CTX *)local_38,(BN_MONT_CTX *)local_58);
                  }
                  else {
                    in_stack_ffffffffffffff80 = local_38;
                    pBVar4 = local_58;
                    iVar2 = (**(code **)(*(long *)(local_30 + 0x98) + 0x20))
                                      (local_30,local_50,*(undefined8 *)(local_30 + 0x18),local_40,
                                       *(undefined8 *)(local_30 + 0x60),local_48,
                                       *(undefined8 *)(local_30 + 8));
                    line = (int)((ulong)pBVar4 >> 0x20);
                  }
                  if ((iVar2 != 0) &&
                     (iVar2 = BN_div((BIGNUM *)0x0,local_40,local_50,*(BIGNUM **)(local_30 + 0x10),
                                     (BN_CTX *)local_38), iVar2 != 0)) {
                    iVar2 = BN_ucmp(local_40,(BIGNUM *)local_60);
                    uVar5 = (uint)(iVar2 == 0);
                  }
                }
              }
            }
            else {
              uVar5 = 0;
            }
          }
          else {
            uVar5 = 0;
          }
        }
        if ((int)uVar5 < 0) {
          ERR_new();
          ERR_set_debug((char *)CONCAT44(uVar5,iVar1),line,(char *)in_stack_ffffffffffffff80);
          ERR_set_error(10,0x80003,(char *)0x0);
        }
        BN_CTX_free((BN_CTX *)local_38);
        BN_free(local_40);
        BN_free(local_48);
        BN_free(local_50);
        local_c = uVar5;
      }
      else {
        ERR_new();
        ERR_set_debug((char *)CONCAT44(uVar5,iVar1),line,(char *)in_stack_ffffffffffffff80);
        ERR_set_error(10,0x67,(char *)0x0);
        local_c = 0xffffffff;
      }
    }
    else {
      ERR_new();
      ERR_set_debug((char *)CONCAT44(uVar5,iVar1),line,(char *)in_stack_ffffffffffffff80);
      ERR_set_error(10,0x66,(char *)0x0);
      local_c = 0xffffffff;
    }
  }
  return local_c;
}

Assistant:

static int dsa_do_verify(const unsigned char *dgst, int dgst_len,
                         DSA_SIG *sig, DSA *dsa)
{
    BN_CTX *ctx;
    BIGNUM *u1, *u2, *t1;
    BN_MONT_CTX *mont = NULL;
    const BIGNUM *r, *s;
    int ret = -1, i;

    if (dsa->params.p == NULL
        || dsa->params.q == NULL
        || dsa->params.g == NULL) {
        ERR_raise(ERR_LIB_DSA, DSA_R_MISSING_PARAMETERS);
        return -1;
    }

    i = BN_num_bits(dsa->params.q);
    /* fips 186-3 allows only different sizes for q */
    if (i != 160 && i != 224 && i != 256) {
        ERR_raise(ERR_LIB_DSA, DSA_R_BAD_Q_VALUE);
        return -1;
    }

    if (BN_num_bits(dsa->params.p) > OPENSSL_DSA_MAX_MODULUS_BITS) {
        ERR_raise(ERR_LIB_DSA, DSA_R_MODULUS_TOO_LARGE);
        return -1;
    }
    u1 = BN_new();
    u2 = BN_new();
    t1 = BN_new();
    ctx = BN_CTX_new_ex(NULL); /* verify does not need a libctx */
    if (u1 == NULL || u2 == NULL || t1 == NULL || ctx == NULL)
        goto err;

    DSA_SIG_get0(sig, &r, &s);

    if (BN_is_zero(r) || BN_is_negative(r) ||
        BN_ucmp(r, dsa->params.q) >= 0) {
        ret = 0;
        goto err;
    }
    if (BN_is_zero(s) || BN_is_negative(s) ||
        BN_ucmp(s, dsa->params.q) >= 0) {
        ret = 0;
        goto err;
    }

    /*
     * Calculate W = inv(S) mod Q save W in u2
     */
    if ((BN_mod_inverse(u2, s, dsa->params.q, ctx)) == NULL)
        goto err;

    /* save M in u1 */
    if (dgst_len > (i >> 3))
        /*
         * if the digest length is greater than the size of q use the
         * BN_num_bits(dsa->q) leftmost bits of the digest, see fips 186-3,
         * 4.2
         */
        dgst_len = (i >> 3);
    if (BN_bin2bn(dgst, dgst_len, u1) == NULL)
        goto err;

    /* u1 = M * w mod q */
    if (!BN_mod_mul(u1, u1, u2, dsa->params.q, ctx))
        goto err;

    /* u2 = r * w mod q */
    if (!BN_mod_mul(u2, r, u2, dsa->params.q, ctx))
        goto err;

    if (dsa->flags & DSA_FLAG_CACHE_MONT_P) {
        mont = BN_MONT_CTX_set_locked(&dsa->method_mont_p,
                                      dsa->lock, dsa->params.p, ctx);
        if (!mont)
            goto err;
    }

    if (dsa->meth->dsa_mod_exp != NULL) {
        if (!dsa->meth->dsa_mod_exp(dsa, t1, dsa->params.g, u1, dsa->pub_key, u2,
                                    dsa->params.p, ctx, mont))
            goto err;
    } else {
        if (!BN_mod_exp2_mont(t1, dsa->params.g, u1, dsa->pub_key, u2,
                              dsa->params.p, ctx, mont))
            goto err;
    }

    /* let u1 = u1 mod q */
    if (!BN_mod(u1, t1, dsa->params.q, ctx))
        goto err;

    /*
     * V is now in u1.  If the signature is correct, it will be equal to R.
     */
    ret = (BN_ucmp(u1, r) == 0);

 err:
    if (ret < 0)
        ERR_raise(ERR_LIB_DSA, ERR_R_BN_LIB);
    BN_CTX_free(ctx);
    BN_free(u1);
    BN_free(u2);
    BN_free(t1);
    return ret;
}